

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O0

CURLcode Curl_fillreadbuffer(connectdata *conn,size_t bytes,size_t *nreadp)

{
  Curl_easy *data_00;
  char *pcVar1;
  int iVar2;
  long lVar3;
  size_t sVar4;
  char *pcStack_68;
  int hexlen;
  char *endofline_network;
  char *endofline_native;
  char hexbuffer [11];
  SingleRequest *k;
  size_t nread;
  size_t buffersize;
  Curl_easy *data;
  size_t *nreadp_local;
  size_t bytes_local;
  connectdata *conn_local;
  
  data_00 = conn->data;
  nread = bytes;
  if (((data_00->req).upload_chunky & 1U) != 0) {
    nread = bytes - 0xc;
    (data_00->req).upload_fromhere = (data_00->req).upload_fromhere + 10;
  }
  Curl_set_in_callback(data_00,true);
  k = (SingleRequest *)
      (*(data_00->state).fread_func)((data_00->req).upload_fromhere,1,nread,(data_00->state).in);
  Curl_set_in_callback(data_00,false);
  if (k == (SingleRequest *)0x10000000) {
    Curl_failf(data_00,"operation aborted by callback");
    *nreadp = 0;
    conn_local._4_4_ = CURLE_ABORTED_BY_CALLBACK;
  }
  else if (k == (SingleRequest *)0x10000001) {
    hexbuffer._3_8_ = &data_00->req;
    if ((conn->handler->flags & 0x10) == 0) {
      (data_00->req).keepon = (data_00->req).keepon | 0x20;
      if (((data_00->req).upload_chunky & 1U) != 0) {
        (data_00->req).upload_fromhere = (data_00->req).upload_fromhere + -10;
      }
      *nreadp = 0;
      conn_local._4_4_ = CURLE_OK;
    }
    else {
      Curl_failf(data_00,"Read callback asked for PAUSE when not supported!");
      conn_local._4_4_ = CURLE_READ_ERROR;
    }
  }
  else if (nread < k) {
    *nreadp = 0;
    Curl_failf(data_00,"read function returned funny value");
    conn_local._4_4_ = CURLE_READ_ERROR;
  }
  else {
    if ((((data_00->req).forbidchunk & 1U) == 0) && (((data_00->req).upload_chunky & 1U) != 0)) {
      if ((((data_00->set).prefer_ascii & 1U) == 0) && (((data_00->set).crlf & 1U) == 0)) {
        pcVar1 = " \t\r\n";
        pcStack_68 = " \t\r\n";
      }
      else {
        pcVar1 = " \t\n";
        pcStack_68 = " \t\n";
      }
      endofline_network = pcVar1 + 2;
      pcStack_68 = pcStack_68 + 2;
      iVar2 = curl_msnprintf((char *)((long)&endofline_native + 5),0xb,"%x%s",k,endofline_network);
      (data_00->req).upload_fromhere = (data_00->req).upload_fromhere + -(long)iVar2;
      lVar3 = (long)&k->size + (long)iVar2;
      memcpy((data_00->req).upload_fromhere,(void *)((long)&endofline_native + 5),(long)iVar2);
      pcVar1 = (data_00->req).upload_fromhere;
      sVar4 = strlen(pcStack_68);
      memcpy(pcVar1 + lVar3,pcStack_68,sVar4);
      if (lVar3 == iVar2) {
        (data_00->req).upload_done = true;
        Curl_infof(data_00,"Signaling end of chunked upload via terminating chunk.\n");
      }
      sVar4 = strlen(endofline_network);
      k = (SingleRequest *)(sVar4 + lVar3);
    }
    *nreadp = (size_t)k;
    conn_local._4_4_ = CURLE_OK;
  }
  return conn_local._4_4_;
}

Assistant:

CURLcode Curl_fillreadbuffer(struct connectdata *conn, size_t bytes,
                             size_t *nreadp)
{
  struct Curl_easy *data = conn->data;
  size_t buffersize = bytes;
  size_t nread;
#ifdef CURL_DOES_CONVERSIONS
  bool sending_http_headers = FALSE;

  if(conn->handler->protocol&(PROTO_FAMILY_HTTP|CURLPROTO_RTSP)) {
    const struct HTTP *http = data->req.protop;

    if(http->sending == HTTPSEND_REQUEST)
      /* We're sending the HTTP request headers, not the data.
         Remember that so we don't re-translate them into garbage. */
      sending_http_headers = TRUE;
  }
#endif

  if(data->req.upload_chunky) {
    /* if chunked Transfer-Encoding */
    buffersize -= (8 + 2 + 2);   /* 32bit hex + CRLF + CRLF */
    data->req.upload_fromhere += (8 + 2); /* 32bit hex + CRLF */
  }

  Curl_set_in_callback(data, true);
  nread = data->state.fread_func(data->req.upload_fromhere, 1,
                                 buffersize, data->state.in);
  Curl_set_in_callback(data, false);

  if(nread == CURL_READFUNC_ABORT) {
    failf(data, "operation aborted by callback");
    *nreadp = 0;
    return CURLE_ABORTED_BY_CALLBACK;
  }
  if(nread == CURL_READFUNC_PAUSE) {
    struct SingleRequest *k = &data->req;

    if(conn->handler->flags & PROTOPT_NONETWORK) {
      /* protocols that work without network cannot be paused. This is
         actually only FILE:// just now, and it can't pause since the transfer
         isn't done using the "normal" procedure. */
      failf(data, "Read callback asked for PAUSE when not supported!");
      return CURLE_READ_ERROR;
    }

    /* CURL_READFUNC_PAUSE pauses read callbacks that feed socket writes */
    k->keepon |= KEEP_SEND_PAUSE; /* mark socket send as paused */
    if(data->req.upload_chunky) {
        /* Back out the preallocation done above */
      data->req.upload_fromhere -= (8 + 2);
    }
    *nreadp = 0;

    return CURLE_OK; /* nothing was read */
  }
  else if(nread > buffersize) {
    /* the read function returned a too large value */
    *nreadp = 0;
    failf(data, "read function returned funny value");
    return CURLE_READ_ERROR;
  }

  if(!data->req.forbidchunk && data->req.upload_chunky) {
    /* if chunked Transfer-Encoding
     *    build chunk:
     *
     *        <HEX SIZE> CRLF
     *        <DATA> CRLF
     */
    /* On non-ASCII platforms the <DATA> may or may not be
       translated based on set.prefer_ascii while the protocol
       portion must always be translated to the network encoding.
       To further complicate matters, line end conversion might be
       done later on, so we need to prevent CRLFs from becoming
       CRCRLFs if that's the case.  To do this we use bare LFs
       here, knowing they'll become CRLFs later on.
     */

    char hexbuffer[11];
    const char *endofline_native;
    const char *endofline_network;
    int hexlen;

    if(
#ifdef CURL_DO_LINEEND_CONV
       (data->set.prefer_ascii) ||
#endif
       (data->set.crlf)) {
      /* \n will become \r\n later on */
      endofline_native  = "\n";
      endofline_network = "\x0a";
    }
    else {
      endofline_native  = "\r\n";
      endofline_network = "\x0d\x0a";
    }
    hexlen = snprintf(hexbuffer, sizeof(hexbuffer),
                      "%x%s", nread, endofline_native);

    /* move buffer pointer */
    data->req.upload_fromhere -= hexlen;
    nread += hexlen;

    /* copy the prefix to the buffer, leaving out the NUL */
    memcpy(data->req.upload_fromhere, hexbuffer, hexlen);

    /* always append ASCII CRLF to the data */
    memcpy(data->req.upload_fromhere + nread,
           endofline_network,
           strlen(endofline_network));

#ifdef CURL_DOES_CONVERSIONS
    {
      CURLcode result;
      size_t length;
      if(data->set.prefer_ascii)
        /* translate the protocol and data */
        length = nread;
      else
        /* just translate the protocol portion */
        length = strlen(hexbuffer);
      result = Curl_convert_to_network(data, data->req.upload_fromhere,
                                       length);
      /* Curl_convert_to_network calls failf if unsuccessful */
      if(result)
        return result;
    }
#endif /* CURL_DOES_CONVERSIONS */

    if((nread - hexlen) == 0) {
      /* mark this as done once this chunk is transferred */
      data->req.upload_done = TRUE;
      infof(data, "Signaling end of chunked upload via terminating chunk.\n");
    }

    nread += strlen(endofline_native); /* for the added end of line */
  }
#ifdef CURL_DOES_CONVERSIONS
  else if((data->set.prefer_ascii) && (!sending_http_headers)) {
    CURLcode result;
    result = Curl_convert_to_network(data, data->req.upload_fromhere, nread);
    /* Curl_convert_to_network calls failf if unsuccessful */
    if(result)
      return result;
  }
#endif /* CURL_DOES_CONVERSIONS */

  *nreadp = nread;

  return CURLE_OK;
}